

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O2

void __thiscall
Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>::PageSegmentBase
          (PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *this,
          PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
          *allocator,void *address,uint pageCount,uint committedCount,bool enableWriteBarrier)

{
  undefined1 *puVar1;
  
  SegmentBase<Memory::PreReservedVirtualAllocWrapper>::SegmentBase
            (&this->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>,allocator,
             (ulong)allocator->maxAllocPageCount,enableWriteBarrier);
  (this->decommitPages).data[3].word = 0;
  (this->decommitPages).data[4].word = 0;
  (this->decommitPages).data[1].word = 0;
  (this->decommitPages).data[2].word = 0;
  (this->freePages).data[4].word = 0;
  (this->decommitPages).data[0].word = 0;
  (this->freePages).data[2].word = 0;
  (this->freePages).data[3].word = 0;
  this->freePageCount = 0;
  this->decommitPageCount = 0;
  (this->freePages).data[0].word = 0;
  (this->freePages).data[1].word = 0;
  puVar1 = &(this->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>).field_0x2c;
  *puVar1 = *puVar1 | 4;
  (this->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>).address = (char *)address;
  (this->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>).segmentPageCount =
       (ulong)pageCount;
  return;
}

Assistant:

PageSegmentBase<T>::PageSegmentBase(PageAllocatorBase<T> * allocator, void* address, uint pageCount, uint committedCount, bool enableWriteBarrier) :
    SegmentBase<T>(allocator, allocator->maxAllocPageCount, enableWriteBarrier), decommitPageCount(0), freePageCount(0)
{
#if DBG
    this->isPageSegment = true;
#endif // DBG
    this->address = (char*)address;
    this->segmentPageCount = pageCount;
}